

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap_allocator.h
# Opt level: O0

void __thiscall
tcmalloc::PageHeapAllocator<tcmalloc::Span>::Init(PageHeapAllocator<tcmalloc::Span> *this)

{
  Span *p;
  PageHeapAllocator<tcmalloc::Span> *this_local;
  
  this->inuse_ = 0;
  this->free_area_ = (char *)0x0;
  this->free_avail_ = 0;
  this->free_list_ = (void *)0x0;
  p = New(this);
  Delete(this,p);
  return;
}

Assistant:

void Init() {
    ASSERT(sizeof(T) <= kAllocIncrement);
    inuse_ = 0;
    free_area_ = nullptr;
    free_avail_ = 0;
    free_list_ = nullptr;
    // Reserve some space at the beginning to avoid fragmentation.
    Delete(New());
  }